

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::to_qualifiers_glsl_abi_cxx11_(CompilerGLSL *this,uint32_t id)

{
  bool bVar1;
  int iVar2;
  mapped_type *pmVar3;
  undefined4 extraout_var;
  SPIRType *pSVar4;
  char *pcVar5;
  uint32_t in_EDX;
  undefined4 in_register_00000034;
  CompilerGLSL *this_00;
  SPIRType *type;
  SPIRVariable *local_38;
  SPIRVariable *var;
  Bitset *local_28;
  Bitset *flags;
  CompilerGLSL *pCStack_18;
  uint32_t id_local;
  CompilerGLSL *this_local;
  string *res;
  
  this_00 = (CompilerGLSL *)CONCAT44(in_register_00000034,id);
  flags._4_4_ = in_EDX;
  pCStack_18 = this_00;
  this_local = this;
  TypedID<(spirv_cross::Types)0>::TypedID((TypedID<(spirv_cross::Types)0> *)((long)&var + 4),in_EDX)
  ;
  pmVar3 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this_00->super_Compiler).ir.meta,
                        (TypedID<(spirv_cross::Types)0> *)((long)&var + 4));
  local_28 = &(pmVar3->decoration).decoration_flags;
  var._3_1_ = 0;
  ::std::__cxx11::string::string((string *)this);
  local_38 = Compiler::maybe_get<spirv_cross::SPIRVariable>((Compiler *)this_00,flags._4_4_);
  if (((local_38 != (SPIRVariable *)0x0) && (local_38->storage == StorageClassWorkgroup)) &&
     (((this_00->backend).shared_is_implied & 1U) == 0)) {
    ::std::__cxx11::string::operator+=((string *)this,"shared ");
  }
  (*(this_00->super_Compiler)._vptr_Compiler[0x2e])(&type,this_00,local_28);
  ::std::__cxx11::string::operator+=((string *)this,(string *)&type);
  ::std::__cxx11::string::~string((string *)&type);
  if (local_38 != (SPIRVariable *)0x0) {
    iVar2 = (*(this_00->super_Compiler)._vptr_Compiler[0x2c])(this_00,local_38);
    ::std::__cxx11::string::operator+=((string *)this,(char *)CONCAT44(extraout_var,iVar2));
  }
  pSVar4 = Compiler::expression_type((Compiler *)this_00,flags._4_4_);
  if (((pSVar4->image).dim != DimSubpassData) && ((pSVar4->image).sampled == 2)) {
    bVar1 = Bitset::get(local_28,0x17);
    if (bVar1) {
      ::std::__cxx11::string::operator+=((string *)this,"coherent ");
    }
    bVar1 = Bitset::get(local_28,0x13);
    if (bVar1) {
      ::std::__cxx11::string::operator+=((string *)this,"restrict ");
    }
    bVar1 = Bitset::get(local_28,0x18);
    if (bVar1) {
      ::std::__cxx11::string::operator+=((string *)this,"readonly ");
    }
    bVar1 = Bitset::get(local_28,0x19);
    if (bVar1) {
      ::std::__cxx11::string::operator+=((string *)this,"writeonly ");
    }
  }
  pcVar5 = to_precision_qualifiers_glsl(this_00,flags._4_4_);
  ::std::__cxx11::string::operator+=((string *)this,pcVar5);
  return this;
}

Assistant:

string CompilerGLSL::to_qualifiers_glsl(uint32_t id)
{
	auto &flags = ir.meta[id].decoration.decoration_flags;
	string res;

	auto *var = maybe_get<SPIRVariable>(id);

	if (var && var->storage == StorageClassWorkgroup && !backend.shared_is_implied)
		res += "shared ";

	res += to_interpolation_qualifiers(flags);
	if (var)
		res += to_storage_qualifiers_glsl(*var);

	auto &type = expression_type(id);
	if (type.image.dim != DimSubpassData && type.image.sampled == 2)
	{
		if (flags.get(DecorationCoherent))
			res += "coherent ";
		if (flags.get(DecorationRestrict))
			res += "restrict ";
		if (flags.get(DecorationNonWritable))
			res += "readonly ";
		if (flags.get(DecorationNonReadable))
			res += "writeonly ";
	}

	res += to_precision_qualifiers_glsl(id);

	return res;
}